

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O1

void ncnn::convdw3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  size_t sVar17;
  size_t sVar18;
  void *pvVar19;
  size_t sVar20;
  size_t sVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  long lVar31;
  float *pfVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  float *pfVar36;
  float *pfVar37;
  int iVar38;
  uint uVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  
  iVar11 = bottom_blob->c;
  if (0 < (long)iVar11) {
    iVar12 = top_blob->w;
    uVar13 = top_blob->h;
    pvVar14 = _kernel->data;
    pvVar15 = _bias->data;
    lVar31 = (long)bottom_blob->w;
    lVar1 = lVar31 + 2;
    pvVar16 = top_blob->data;
    sVar17 = top_blob->cstep;
    sVar18 = top_blob->elemsize;
    pvVar19 = bottom_blob->data;
    sVar20 = bottom_blob->cstep;
    sVar21 = bottom_blob->elemsize;
    lVar35 = 0;
    do {
      if (pvVar15 == (void *)0x0) {
        fVar43 = 0.0;
      }
      else {
        fVar43 = *(float *)((long)pvVar15 + lVar35 * 4);
      }
      pfVar40 = (float *)(sVar17 * sVar18 * lVar35 + (long)pvVar16);
      pfVar42 = (float *)(sVar20 * sVar21 * lVar35 + (long)pvVar19);
      lVar22 = lVar35 * 0x24;
      pfVar37 = pfVar42 + lVar31;
      pfVar32 = pfVar42 + lVar31 * 2;
      pfVar41 = pfVar40;
      uVar39 = 0;
      if (1 < (int)uVar13) {
        pfVar36 = pfVar42 + lVar31 * 3;
        iVar33 = 0;
        do {
          pfVar40 = pfVar40 + iVar12;
          if (0 < iVar12) {
            lVar34 = 0;
            iVar38 = iVar12 + 1;
            do {
              uVar9 = *(undefined8 *)((long)pfVar42 + lVar34 + 4);
              uVar10 = *(undefined8 *)((long)pfVar37 + lVar34 + 4);
              pfVar2 = (float *)((long)pvVar14 + lVar22);
              fVar23 = *pfVar2;
              fVar24 = pfVar2[1];
              fVar25 = pfVar2[2];
              fVar26 = pfVar2[3];
              pfVar2 = (float *)((long)pvVar14 + lVar22 + 0x10);
              fVar27 = *pfVar2;
              fVar28 = pfVar2[1];
              fVar29 = pfVar2[2];
              fVar30 = pfVar2[3];
              fVar5 = *(float *)((long)pfVar37 + lVar34);
              fVar44 = (float)uVar10;
              fVar45 = (float)((ulong)uVar10 >> 0x20);
              fVar46 = (float)*(undefined8 *)((long)pfVar32 + lVar34);
              fVar47 = (float)((ulong)*(undefined8 *)((long)pfVar32 + lVar34) >> 0x20);
              fVar6 = *(float *)((long)pfVar32 + lVar34 + 8);
              fVar7 = *(float *)((long)pvVar14 + lVar22 + 0x20);
              uVar10 = *(undefined8 *)((long)pfVar36 + lVar34);
              fVar8 = *(float *)((long)pfVar36 + lVar34 + 8);
              *(float *)((long)pfVar41 + lVar34) =
                   fVar7 * fVar6 + fVar43 +
                   fVar47 * fVar30 + fVar5 * fVar26 + fVar45 * fVar28 + (float)uVar9 * fVar24 +
                   fVar46 * fVar29 + (float)((ulong)uVar9 >> 0x20) * fVar25 +
                   fVar44 * fVar27 + *(float *)((long)pfVar42 + lVar34) * fVar23;
              *(float *)((long)pfVar40 + lVar34) =
                   fVar7 * fVar8 + fVar43 +
                   (float)((ulong)uVar10 >> 0x20) * fVar30 + fVar26 * fVar46 +
                   fVar6 * fVar28 + fVar24 * fVar44 +
                   (float)uVar10 * fVar29 + fVar25 * fVar45 + fVar47 * fVar27 + fVar5 * fVar23;
              lVar34 = lVar34 + 4;
              iVar38 = iVar38 + -1;
            } while (1 < iVar38);
            pfVar41 = (float *)((long)pfVar41 + lVar34);
            pfVar40 = (float *)((long)pfVar40 + lVar34);
            pfVar42 = (float *)((long)pfVar42 + lVar34);
            pfVar37 = (float *)((long)pfVar37 + lVar34);
            pfVar32 = (float *)((long)pfVar32 + lVar34);
            pfVar36 = (float *)((long)pfVar36 + lVar34);
          }
          pfVar42 = pfVar42 + lVar1;
          pfVar37 = pfVar37 + lVar1;
          pfVar32 = pfVar32 + lVar1;
          pfVar36 = pfVar36 + lVar1;
          pfVar41 = pfVar41 + iVar12;
          iVar38 = iVar33 + 3;
          iVar33 = iVar33 + 2;
          uVar39 = uVar13 & 0xfffffffe;
        } while (iVar38 < (int)uVar13);
      }
      if ((int)uVar39 < (int)uVar13) {
        do {
          iVar33 = iVar12 + 1;
          if (0 < iVar12) {
            do {
              pfVar40 = pfVar42 + 1;
              fVar5 = *pfVar42;
              pfVar42 = pfVar42 + 1;
              fVar6 = *pfVar37;
              pfVar36 = pfVar37 + 1;
              pfVar37 = pfVar37 + 1;
              uVar9 = *(undefined8 *)pfVar32;
              pfVar2 = pfVar32 + 2;
              pfVar32 = pfVar32 + 1;
              pfVar3 = (float *)((long)pvVar14 + lVar22);
              pfVar4 = (float *)((long)pvVar14 + lVar22 + 0x10);
              *pfVar41 = *(float *)((long)pvVar14 + lVar22 + 0x20) * *pfVar2 + fVar43 +
                         (float)((ulong)uVar9 >> 0x20) * pfVar4[3] + fVar6 * pfVar3[3] +
                         (float)((ulong)*(undefined8 *)pfVar36 >> 0x20) * pfVar4[1] +
                         (float)*(undefined8 *)pfVar40 * pfVar3[1] +
                         (float)uVar9 * pfVar4[2] +
                         (float)((ulong)*(undefined8 *)pfVar40 >> 0x20) * pfVar3[2] +
                         (float)*(undefined8 *)pfVar36 * *pfVar4 + fVar5 * *pfVar3;
              pfVar41 = pfVar41 + 1;
              iVar33 = iVar33 + -1;
            } while (1 < iVar33);
          }
          pfVar42 = pfVar42 + 2;
          pfVar37 = pfVar37 + 2;
          pfVar32 = pfVar32 + 2;
          uVar39 = uVar39 + 1;
        } while (uVar39 != uVar13);
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 != iVar11);
  }
  return;
}

Assistant:

static void convdw3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g=0; g<group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g*9;

        float* outptr = out;
        float* outptr2 = outptr + outw;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w*2;
        const float* r3 = img0 + w*3;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i+1 < outh; i+=2)
        {

            int remain = outw;

            for (; remain>0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                float sum2 = bias0;
                sum2 += r1[0] * k0[0];
                sum2 += r1[1] * k0[1];
                sum2 += r1[2] * k0[2];
                sum2 += r2[0] * k1[0];
                sum2 += r2[1] * k1[1];
                sum2 += r2[2] * k1[2];
                sum2 += r3[0] * k2[0];
                sum2 += r3[1] * k2[1];
                sum2 += r3[2] * k2[2];

                *outptr = sum;
                *outptr2 = sum2;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
                outptr2++;
            }

            r0 += 2 + w;
            r1 += 2 + w;
            r2 += 2 + w;
            r3 += 2 + w;

            outptr += outw;
            outptr2 += outw;
        }

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain>0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}